

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

char * lua_getlocal(lua_State *L,lua_Debug *ar,int n)

{
  Value *pVVar1;
  TValue *io1;
  StkId pos;
  char *name;
  lua_Debug *plStack_18;
  int n_local;
  lua_Debug *ar_local;
  lua_State *L_local;
  
  name._4_4_ = n;
  plStack_18 = ar;
  ar_local = (lua_Debug *)L;
  swapextra(L);
  if (plStack_18 == (lua_Debug *)0x0) {
    if (*(int *)(ar_local->namewhat + -8) == 0x46) {
      pos = (StkId)luaF_getlocalname(*(Proto **)(*(long *)(ar_local->namewhat + -0x10) + 0x18),
                                     name._4_4_,0);
    }
    else {
      pos = (StkId)0x0;
    }
  }
  else {
    io1 = (TValue *)0x0;
    pos = (StkId)findlocal((lua_State *)ar_local,plStack_18->i_ci,name._4_4_,&io1);
    if (pos != (StkId)0x0) {
      pVVar1 = (Value *)ar_local->namewhat;
      *pVVar1 = io1->value_;
      pVVar1[1] = *(Value *)&io1->tt_;
      ar_local->namewhat = ar_local->namewhat + 0x10;
    }
  }
  swapextra((lua_State *)ar_local);
  return (char *)pos;
}

Assistant:

LUA_API const char *lua_getlocal(lua_State *L, const lua_Debug *ar, int n) {
    const char *name;
    lua_lock(L);
    swapextra(L);
    if (ar == NULL) {  /* information about non-active function? */
        if (!isLfunction(L->top - 1))  /* not a Lua function? */
            name = NULL;
        else  /* consider live variables at function start (parameters) */
            name = luaF_getlocalname(clLvalue(L->top - 1)->p, n, 0);
    } else {  /* active function; get information through 'ar' */
        StkId pos = NULL;  /* to avoid warnings */
        name = findlocal(L, ar->i_ci, n, &pos);
        if (name) {
            setobj2s(L, L->top, pos);
            api_incr_top(L);
        }
    }
    swapextra(L);
    lua_unlock(L);
    return name;
}